

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::createAndUploadTexture
          (TextureGatherCubeCase *this)

{
  MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *this_00;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *pvVar1;
  ostringstream *this_01;
  RenderContext *context;
  TextureCube *pTVar2;
  TextureGatherCubeCase *pTVar3;
  TextureFormat TVar4;
  int iVar5;
  deUint32 internalFormat;
  int iVar6;
  CubeFace CVar7;
  undefined4 extraout_var;
  TextureCube *pTVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  ulong *puVar12;
  pointer pPVar13;
  void *__buf;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar14;
  long lVar15;
  CubeFace face;
  ulong uVar16;
  long lVar17;
  long lVar18;
  TextureFormat this_02;
  long lVar19;
  ConstPixelBufferAccess *access;
  long lVar20;
  ostringstream s;
  TextureFormatInfo texFmtInfo;
  string local_398;
  string local_378;
  ulong *local_358;
  long local_350;
  ulong local_348;
  long lStack_340;
  TextureCube *local_338;
  TextureCube *local_330;
  TextureGatherCubeCase *local_328;
  TextureFormat local_320;
  TextureCube *local_318;
  MaybeTextureSwizzle *local_310;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_308;
  long *local_300 [2];
  long local_2f0 [2];
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0 [2];
  MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *local_2c0;
  long local_2b8;
  long local_2b0;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_2a8;
  string local_2a0;
  LogImage local_280;
  undefined1 local_1f0 [120];
  ios_base local_178 [264];
  TextureFormatInfo local_70;
  
  this_02 = (TextureFormat)
            ((this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
            ->m_log;
  context = ((this->super_TextureGatherCase).super_TestCase.m_context)->m_renderCtx;
  iVar5 = (*context->_vptr_RenderContext[3])(context);
  local_2b8 = CONCAT44(extraout_var,iVar5);
  tcu::getTextureFormatInfo(&local_70,&(this->super_TextureGatherCase).m_textureFormat);
  pTVar8 = (TextureCube *)operator_new(0x180);
  internalFormat = glu::getInternalFormat((this->super_TextureGatherCase).m_textureFormat);
  glu::TextureCube::TextureCube(pTVar8,context,internalFormat,this->m_textureSize);
  local_1f0._0_4_ = R;
  local_1f0._4_4_ = SNORM_INT8;
  this_00 = &this->m_texture;
  if ((this->m_texture).super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>.
      m_data.ptr != pTVar8) {
    de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::reset
              (&this_00->super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>);
    (this_00->super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>).m_data.ptr
         = pTVar8;
  }
  de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::reset
            ((UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *)local_1f0);
  local_318 = (this->m_texture).
              super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>.m_data.ptr;
  iVar5 = (this->super_TextureGatherCase).m_baseLevel;
  lVar17 = (long)iVar5;
  if (((this->super_TextureGatherCase).m_minFilter - NEAREST_MIPMAP_NEAREST < 4) &&
     (((this->super_TextureGatherCase).m_flags & 1) == 0)) {
    iVar6 = (int)((ulong)((long)(local_318->m_refTexture).m_access[0].
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_318->m_refTexture).m_access[0].
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  }
  else {
    iVar6 = iVar5 + 1;
  }
  local_338 = &local_318->m_refTexture;
  local_2c0 = this_00;
  if (iVar5 < iVar6) {
    pvVar14 = (local_318->m_refTexture).m_access;
    local_2b0 = (long)iVar6;
    local_328 = this;
    local_320 = this_02;
    local_2a8 = pvVar14;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::ostream::operator<<((ostringstream *)local_1f0,(int)lVar17);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,0x9a4679)
      ;
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      psVar11 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_398.field_2._M_allocated_capacity = *psVar11;
        local_398.field_2._8_8_ = puVar9[3];
      }
      else {
        local_398.field_2._M_allocated_capacity = *psVar11;
        local_398._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_398._M_string_length = puVar9[1];
      *puVar9 = psVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::ostream::operator<<((ostringstream *)local_1f0,(int)lVar17);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_300,0,(char *)0x0,0x9a468b);
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      psVar11 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_378.field_2._M_allocated_capacity = *psVar11;
        local_378.field_2._8_8_ = plVar10[3];
      }
      else {
        local_378.field_2._M_allocated_capacity = *psVar11;
        local_378._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_378._M_string_length = plVar10[1];
      *plVar10 = (long)psVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      tcu::LogImageSet::LogImageSet((LogImageSet *)&local_280,&local_398,&local_378);
      tcu::TestLog::startImageSet
                ((TestLog *)this_02,local_280.m_name._M_dataplus._M_p,
                 local_280.m_description._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
        operator_delete(local_280.m_description._M_dataplus._M_p,
                        local_280.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
        operator_delete(local_280.m_name._M_dataplus._M_p,
                        local_280.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if (local_300[0] != local_2f0) {
        operator_delete(local_300[0],local_2f0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      local_330 = (TextureCube *)lVar17;
      if (local_358 != &local_348) {
        operator_delete(local_358,local_348 + 1);
      }
      lVar17 = 0;
      do {
        pTVar2 = local_330;
        face = (CubeFace)lVar17;
        iVar5 = (int)local_330;
        tcu::TextureCube::allocLevel(local_338,face,iVar5);
        pTVar3 = local_328;
        local_310 = (MaybeTextureSwizzle *)((long)pTVar2 * 5);
        access = (ConstPixelBufferAccess *)
                 ((long)pTVar2 * 0x28 +
                 (long)(pvVar14->
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       )._M_impl.super__Vector_impl_data._M_start);
        CVar7 = tcu::CommandLine::getBaseSeed
                          (((local_328->super_TextureGatherCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_cmdLine);
        fillWithRandomColorTiles
                  ((PixelBufferAccess *)access,&local_70.valueMin,&local_70.valueMax,face ^ CVar7);
        local_308 = (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                    ((pTVar3->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
        std::ostream::operator<<((ostringstream *)local_1f0,iVar5);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
        std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_300,0,(char *)0x0,0x9a4679);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        psVar11 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_378.field_2._M_allocated_capacity = *psVar11;
          local_378.field_2._8_8_ = plVar10[3];
        }
        else {
          local_378.field_2._M_allocated_capacity = *psVar11;
          local_378._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_378._M_string_length = plVar10[1];
        *plVar10 = (long)psVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_378);
        local_358 = &local_348;
        puVar12 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar12) {
          local_348 = *puVar12;
          lStack_340 = plVar10[3];
        }
        else {
          local_348 = *puVar12;
          local_358 = (ulong *)*plVar10;
        }
        local_350 = plVar10[1];
        *plVar10 = (long)puVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
        std::ostream::operator<<((ostringstream *)local_1f0,face);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
        std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
        uVar16 = 0xf;
        if (local_358 != &local_348) {
          uVar16 = local_348;
        }
        if (uVar16 < (ulong)(local_2d8 + local_350)) {
          uVar16 = 0xf;
          if (local_2e0 != local_2d0) {
            uVar16 = local_2d0[0];
          }
          if (uVar16 < (ulong)(local_2d8 + local_350)) goto LAB_005fd6a5;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_358);
        }
        else {
LAB_005fd6a5:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_2e0);
        }
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        psVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_398.field_2._M_allocated_capacity = *psVar11;
          local_398.field_2._8_8_ = puVar9[3];
        }
        else {
          local_398.field_2._M_allocated_capacity = *psVar11;
          local_398._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_398._M_string_length = puVar9[1];
        *puVar9 = psVar11;
        puVar9[1] = 0;
        *(undefined1 *)psVar11 = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
        tcu::operator<<((ostream *)local_1f0,face);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
        std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
        tcu::LogImage::LogImage
                  (&local_280,&local_398,&local_2a0,access,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_280,(int)local_308,__buf,(size_t)access);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
          operator_delete(local_280.m_description._M_dataplus._M_p,
                          local_280.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
          operator_delete(local_280.m_name._M_dataplus._M_p,
                          local_280.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        if (local_2e0 != local_2d0) {
          operator_delete(local_2e0,local_2d0[0] + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        if (local_300[0] != local_2f0) {
          operator_delete(local_300[0],local_2f0[0] + 1);
        }
        this_02 = local_320;
        lVar17 = lVar17 + 1;
        pvVar14 = pvVar14 + 1;
      } while (lVar17 != 6);
      tcu::TestLog::endImageSet((TestLog *)local_320);
      TVar4 = local_320;
      local_320.order = this_02.order;
      local_320.type = this_02.type;
      local_1f0._0_4_ = local_320.order;
      local_1f0._4_4_ = local_320.type;
      this_01 = (ostringstream *)(local_1f0 + 8);
      local_320 = TVar4;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"Note: texture level\'s size is ",0x1e);
      pvVar14 = local_2a8;
      std::ostream::operator<<
                (this_01,*(int *)((long)(local_2a8->
                                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 8 +
                                 (long)local_310 * 8));
      this = local_328;
      pTVar2 = local_330;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base(local_178);
      lVar17 = (long)pTVar2 + 1;
    } while (lVar17 != local_2b0);
  }
  pTVar8 = local_318;
  tcu::TextureCube::TextureCube
            ((TextureCube *)local_1f0,&local_338->m_format,(local_318->m_refTexture).m_size);
  local_330 = &this->m_swizzledTexture;
  tcu::TextureCube::operator=(&this->m_swizzledTexture,(TextureCube *)local_1f0);
  local_310 = &(this->super_TextureGatherCase).m_textureSwizzle;
  tcu::TextureCube::~TextureCube((TextureCube *)local_1f0);
  local_338 = (TextureCube *)(pTVar8->m_refTexture).m_access;
  local_320 = (TextureFormat)(pTVar8->m_refTexture).m_data;
  local_328 = (TextureGatherCubeCase *)(this->m_swizzledTexture).m_access;
  lVar17 = (long)(pTVar8->m_refTexture).m_access[0].
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pPVar13 = (pTVar8->m_refTexture).m_access[0].
            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar20 = 0;
  do {
    if (0 < (int)((ulong)((long)pPVar13 - lVar17) >> 3) * -0x33333333) {
      pvVar1 = (vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                *)((long)local_320 + lVar20 * 0x18);
      local_308 = (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                  ((long)local_328 + lVar20 * 0x18);
      pvVar14 = (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                ((long)local_338 + lVar20 * 0x18);
      lVar19 = 8;
      lVar15 = 0;
      lVar18 = 0;
      do {
        if (*(long *)((long)(pvVar1->
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar19) != 0) {
          tcu::TextureCube::allocLevel(local_330,(CubeFace)lVar20,(int)lVar18);
          swizzlePixels((PixelBufferAccess *)
                        ((long)(((local_308->
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super_ConstPixelBufferAccess).m_size.m_data + lVar15 + -8),
                        (ConstPixelBufferAccess *)
                        ((long)(pvVar14->
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar15),local_310);
          lVar17 = (long)(local_318->m_refTexture).m_access[0].
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          pPVar13 = (local_318->m_refTexture).m_access[0].
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        lVar18 = lVar18 + 1;
        lVar15 = lVar15 + 0x28;
        lVar19 = lVar19 + 0x10;
      } while (lVar18 < (int)((ulong)((long)pPVar13 - lVar17) >> 3) * -0x33333333);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 6);
  (**(code **)(local_2b8 + 8))(0x84c0);
  glu::TextureCube::upload
            ((local_2c0->super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>).
             m_data.ptr);
  return;
}

Assistant:

void TextureGatherCubeCase::createAndUploadTexture (void)
{
	TestLog&						log			= m_testCtx.getLog();
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_textureFormat);

	m_texture = MovePtr<glu::TextureCube>(new glu::TextureCube(renderCtx, glu::getInternalFormat(m_textureFormat), m_textureSize));

	{
		tcu::TextureCube&	refTexture	= m_texture->getRefTexture();
		const int			levelBegin	= m_baseLevel;
		const int			levelEnd	= isMipmapFilter(m_minFilter) && !(m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ? refTexture.getNumLevels() : m_baseLevel+1;
		DE_ASSERT(m_baseLevel < refTexture.getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			log << TestLog::ImageSet("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx));

			for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
			{
				const tcu::CubeFace			cubeFace	= (tcu::CubeFace)cubeFaceI;
				refTexture.allocLevel(cubeFace, levelNdx);
				const PixelBufferAccess&	levelFace	= refTexture.getLevelFace(levelNdx, cubeFace);
				fillWithRandomColorTiles(levelFace, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_testCtx.getCommandLine().getBaseSeed() ^ (deUint32)cubeFaceI);

				m_testCtx.getLog() << TestLog::Image("InputTextureLevel" + de::toString(levelNdx) + "Face" + de::toString((int)cubeFace),
													 de::toString(cubeFace),
													 levelFace);
			}

			log << TestLog::EndImageSet
				<< TestLog::Message << "Note: texture level's size is " << refTexture.getLevelFace(levelNdx, tcu::CUBEFACE_NEGATIVE_X).getWidth() << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, refTexture, m_textureSwizzle);
	}

	gl.activeTexture(GL_TEXTURE0);
	m_texture->upload();
}